

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1500.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  timeval tVar10;
  int still_running;
  int num;
  int local_44;
  long local_40;
  undefined1 local_34 [4];
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                  ,0x29,iVar2,uVar5);
  }
  if (iVar2 == 0) {
    lVar6 = curl_multi_init();
    iVar4 = 0;
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                    ,0x2b);
      iVar4 = 0x7b;
    }
    iVar9 = 0x77;
    iVar2 = 0x77;
    if (lVar6 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = curl_easy_init();
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                      ,0x2d);
        iVar4 = 0x7c;
      }
      else {
        local_40 = lVar7;
        iVar3 = curl_easy_setopt(lVar7,0x2712,URL);
        uVar1 = _stderr;
        iVar4 = 0;
        if (iVar3 != 0) {
          uVar5 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                        ,0x2f,iVar3,uVar5);
          iVar4 = iVar3;
        }
        lVar7 = local_40;
        if (iVar4 == 0) {
          iVar3 = curl_easy_setopt(local_40,0x2a,1);
          uVar1 = _stderr;
          iVar4 = 0;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                          ,0x30,iVar3,uVar5);
            iVar4 = iVar3;
          }
          lVar7 = local_40;
          if (iVar4 == 0) {
            iVar4 = curl_multi_add_handle(lVar6,local_40);
            uVar1 = _stderr;
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              uVar5 = curl_multi_strerror(iVar4);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                            ,0x32,iVar4,uVar5);
            }
            lVar7 = local_40;
            if (iVar4 == 0) {
              iVar4 = curl_multi_perform(lVar6,&local_44);
              uVar1 = _stderr;
              if (iVar4 == 0) {
                iVar4 = 0;
                if (local_44 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                ,0x34);
                  iVar4 = 0x7a;
                }
              }
              else {
                uVar5 = curl_multi_strerror(iVar4);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                              ,0x34,iVar4,uVar5);
              }
              lVar7 = local_40;
              if (iVar4 == 0) {
                tVar10 = tutil_tvnow();
                lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                if (lVar7 < 0xea61) {
                  if (local_44 == 0) {
                    iVar4 = 0;
                  }
                  else {
                    do {
                      iVar4 = curl_multi_wait(lVar6,0,0,60000,local_34);
                      if (iVar4 == 0) {
                        tVar10 = tutil_tvnow();
                        lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                        iVar4 = 0;
                        if (60000 < lVar7) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                        ,0x41);
                          iVar4 = 0x7d;
                        }
                        iVar3 = 0xc;
                        if (lVar7 < 0xea61) {
                          iVar4 = curl_multi_perform(lVar6);
                          uVar1 = _stderr;
                          if (iVar4 == 0) {
                            iVar4 = 0;
                            if (local_44 < 0) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                            ,0x43);
                              iVar4 = 0x7a;
                            }
                          }
                          else {
                            uVar5 = curl_multi_strerror(iVar4);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                          ,0x43,iVar4,uVar5);
                          }
                          if (iVar4 == 0) {
                            tVar10 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                            iVar3 = 0;
                            iVar4 = 0;
                            if (60000 < lVar7) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                            ,0x45);
                              iVar4 = 0x7d;
                              goto LAB_001015b1;
                            }
                          }
                        }
                      }
                      else {
                        curl_mprintf("curl_multi_wait() returned %d\n");
                        iVar4 = 0x7e;
LAB_001015b1:
                        iVar3 = 0xc;
                      }
                      if (iVar3 != 0) {
                        lVar7 = local_40;
                        if (iVar3 != 0xc) goto LAB_00101756;
                        goto LAB_0010173c;
                      }
                    } while (local_44 != 0);
                  }
                  lVar8 = curl_multi_info_read(lVar6,&local_44);
                  lVar7 = local_40;
                  if (lVar8 != 0) {
                    iVar9 = *(int *)(lVar8 + 0x10);
                  }
                }
                else {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                ,0x36);
                  iVar4 = 0x7d;
                  lVar7 = local_40;
                }
              }
            }
          }
        }
      }
    }
LAB_0010173c:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar7);
    curl_global_cleanup();
    iVar2 = iVar9;
    if (iVar4 != 0) {
      iVar2 = iVar4;
    }
  }
LAB_00101756:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = TEST_ERR_FAILURE;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}